

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkCharacterImmediatelyAfterLiteral
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  bool bVar1;
  UnicodeChar c;
  CompileMessage local_48;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *local_10;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  local_10 = this;
  bVar1 = UTF8Reader::isDigit(&this->input);
  if (!bVar1) {
    c = UTF8Reader::operator*(&this->input);
    bVar1 = IdentifierMatcher::isIdentifierBody(c);
    if (!bVar1) {
      return;
    }
  }
  UTF8Reader::operator=(&(this->location).location,&this->input);
  Errors::unrecognisedLiteralSuffix<>();
  (*this->_vptr_Tokeniser[2])(this,&local_48);
  CompileMessage::~CompileMessage(&local_48);
  return;
}

Assistant:

void checkCharacterImmediatelyAfterLiteral()
    {
        if (input.isDigit() || IdentifierMatcher::isIdentifierBody (*input))
        {
            location.location = input;
            throwError (Errors::unrecognisedLiteralSuffix());
        }
    }